

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateInlineMethods
          (MessageGenerator *this,Printer *p)

{
  Descriptor *this_00;
  ushort *puVar1;
  long *plVar2;
  bool bVar3;
  value_type desc;
  Options *in_RCX;
  cpp *this_01;
  undefined1 cap_next_letter;
  char *pcVar4;
  long lVar5;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  Span<const_google::protobuf::io::Printer::Sub> vars_00;
  string_view input;
  Iterator __begin3;
  Iterator __end3;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  t;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v;
  anon_class_1_0_00000001 local_611;
  Sub *local_610;
  int local_604;
  string local_600;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  Printer *local_580;
  string local_578;
  string local_558;
  Iterator local_538;
  Iterator local_528;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  local_518;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  local_500;
  AnnotationRecord local_4e8;
  AlphaNum *local_4a8;
  pointer local_4a0;
  Sub local_478;
  AlphaNum local_3c0;
  AlphaNum local_390;
  ulong local_360;
  AlphaNum *local_358;
  undefined1 local_330 [80];
  _Alloc_hider local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  _Alloc_hider local_2c0;
  long lStack_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  undefined1 auStack_2a0 [64];
  char acStack_260 [8];
  Sub local_258;
  Sub local_1a0;
  Sub local_e8;
  
  this_00 = this->descriptor_;
  Options::Options((Options *)local_330,&this->options_);
  cpp::anon_unknown_0::ClassVars
            ((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
              *)&local_258,(anon_unknown_0 *)this_00,(Descriptor *)local_330,in_RCX);
  vars.len_ = ((long)(local_258.key_._M_string_length - (long)local_258.key_._M_dataplus._M_p) >> 3)
              * -0x2c8590b21642c859;
  vars.ptr_ = (pointer)local_258.key_._M_dataplus._M_p;
  io::Printer::WithDefs(&local_500,p,vars,false);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)&local_258);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(auStack_2a0 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_p != &local_2b0) {
    operator_delete(local_2c0._M_p,local_2b0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_p != &local_2d0) {
    operator_delete(local_2e0._M_p,local_2d0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_330._48_8_ != local_330 + 0x40) {
    operator_delete((void *)local_330._48_8_,local_330._64_8_ + 1);
  }
  if ((undefined1 *)local_330._16_8_ != local_330 + 0x20) {
    operator_delete((void *)local_330._16_8_,local_330._32_8_ + 1);
  }
  MakeTrackerCalls((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                    *)&local_258,this->descriptor_,&this->options_);
  vars_00.len_ = ((long)(local_258.key_._M_string_length - (long)local_258.key_._M_dataplus._M_p) >>
                 3) * -0x2c8590b21642c859;
  pcVar4 = (char *)0x0;
  vars_00.ptr_ = (pointer)local_258.key_._M_dataplus._M_p;
  io::Printer::WithDefs(&local_518,p,vars_00,false);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)&local_258);
  if ((this->descriptor_->options_->field_0)._impl_.map_entry_ == false) {
    local_580 = p;
    GenerateFieldAccessorDefinitions(this,p);
    local_538.descriptor = this->descriptor_;
    local_538.idx = 0;
    local_528.idx = (local_538.descriptor)->real_oneof_decl_count_;
    local_610 = &local_1a0;
    local_528.descriptor = local_538.descriptor;
    while( true ) {
      cap_next_letter = SUB81(pcVar4,0);
      bVar3 = cpp::operator==(&local_538,&local_528);
      if (bVar3) break;
      desc = OneOfRangeImpl::Iterator::operator*(&local_538);
      local_600._M_dataplus._M_p = (pointer)&local_600.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_600,"oneof_name","");
      puVar1 = (ushort *)(desc->all_names_).payload_;
      local_360 = (ulong)*puVar1;
      local_358 = (AlphaNum *)((long)puVar1 + ~local_360);
      local_390.piece_._M_len = 5;
      local_390.piece_._M_str = "_case";
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_558,(lts_20250127 *)&local_360,&local_390,local_358);
      io::Printer::Sub::Sub<std::__cxx11::string>(&local_478,&local_600,&local_558);
      io::Printer::AnnotationRecord::AnnotationRecord<google::protobuf::OneofDescriptor,_0>
                (&local_4e8,desc,(optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0)
      ;
      io::Printer::Sub::AnnotatedAs(&local_258,&local_478,&local_4e8);
      local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"OneofName","");
      puVar1 = (ushort *)(desc->all_names_).payload_;
      this_01 = (cpp *)(ulong)*puVar1;
      input._M_len = (long)puVar1 + ~(ulong)this_01;
      input._M_str = (char *)0x1;
      UnderscoresToCamelCase_abi_cxx11_(&local_5c0,this_01,input,(bool)cap_next_letter);
      local_4a8 = (AlphaNum *)local_5c0._M_string_length;
      local_4a0 = local_5c0._M_dataplus._M_p;
      local_3c0.piece_._M_len = 4;
      local_3c0.piece_._M_str = "Case";
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_578,(lts_20250127 *)&local_4a8,&local_3c0,
                 (AlphaNum *)local_5c0._M_string_length);
      io::Printer::Sub::Sub<std::__cxx11::string>(&local_1a0,&local_5a0,&local_578);
      local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e0,"oneof_index","");
      local_604 = (int)((ulong)((long)desc - (long)desc->containing_type_->oneof_decls_) >> 3) *
                  -0x49249249;
      io::Printer::Sub::Sub<int>(&local_e8,&local_5e0,&local_604);
      pcVar4 = 
      "\n          inline $classname$::$OneofName$ $classname$::$oneof_name$() const {\n            return $classname$::$OneofName$($oneof_case$[$oneof_index$]);\n          }\n        "
      ;
      io::Printer::Emit(local_580,&local_258,3,0xad);
      lVar5 = 0x228;
      do {
        if (acStack_260[lVar5] == '\x01') {
          std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                    ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                     (auStack_2a0 + lVar5));
        }
        plVar2 = *(long **)((long)&local_2d0 + lVar5 + 8);
        if ((long *)((long)&lStack_2b8 + lVar5) != plVar2) {
          operator_delete(plVar2,*(long *)((long)&lStack_2b8 + lVar5) + 1);
        }
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
          ::_S_vtable._M_arr[(byte)local_2d0._M_local_buf[lVar5]]._M_data)
                  (&local_611,
                   (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                    *)(local_330 + lVar5 + 0x40));
        local_2d0._M_local_buf[lVar5] = -1;
        if ((long *)(local_330 + lVar5 + 0x30) != *(long **)(local_330 + lVar5 + 0x20)) {
          operator_delete(*(long **)(local_330 + lVar5 + 0x20),
                          *(long *)(local_330 + lVar5 + 0x30) + 1);
        }
        lVar5 = lVar5 + -0xb8;
      } while (lVar5 != 0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
        operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
        operator_delete(local_5c0._M_dataplus._M_p,local_5c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
        operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8.file_path._M_dataplus._M_p != &local_4e8.file_path.field_2) {
        operator_delete(local_4e8.file_path._M_dataplus._M_p,
                        local_4e8.file_path.field_2._M_allocated_capacity + 1);
      }
      if (local_4e8.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4e8.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_4e8.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_4e8.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_478.annotation_.
          super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>.
          _M_payload.
          super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
          .super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>._M_engaged
          == true) {
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                   &local_478.annotation_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_478.value_.consume_after._M_dataplus._M_p !=
          &local_478.value_.consume_after.field_2) {
        operator_delete(local_478.value_.consume_after._M_dataplus._M_p,
                        local_478.value_.consume_after.field_2._M_allocated_capacity + 1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr
        [local_478.value_.value.
         super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
         .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
         super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
         super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
         super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
         super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
         _M_index]._M_data)((anon_class_1_0_00000001 *)&local_4a8,&local_478.value_.value);
      local_478.value_.value.
      super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
      .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      _M_index = 0xff;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_478.key_._M_dataplus._M_p != &local_478.key_.field_2) {
        operator_delete(local_478.key_._M_dataplus._M_p,
                        local_478.key_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_558._M_dataplus._M_p != &local_558.field_2) {
        operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_600._M_dataplus._M_p != &local_600.field_2) {
        operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
      }
      local_538.idx = local_538.idx + 1;
    }
  }
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&local_518);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&local_500);
  return;
}

Assistant:

void MessageGenerator::GenerateInlineMethods(io::Printer* p) {
  auto v = p->WithVars(ClassVars(descriptor_, options_));
  auto t = p->WithVars(MakeTrackerCalls(descriptor_, options_));
  if (IsMapEntryMessage(descriptor_)) return;
  GenerateFieldAccessorDefinitions(p);

  // Generate oneof_case() functions.
  for (auto oneof : OneOfRange(descriptor_)) {
    p->Emit(
        {
            Sub{"oneof_name", absl::StrCat(oneof->name(), "_case")}.AnnotatedAs(
                oneof),
            {"OneofName",
             absl::StrCat(UnderscoresToCamelCase(oneof->name(), true), "Case")},
            {"oneof_index", oneof->index()},
        },
        R"cc(
          inline $classname$::$OneofName$ $classname$::$oneof_name$() const {
            return $classname$::$OneofName$($oneof_case$[$oneof_index$]);
          }
        )cc");
  }
}